

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper_functions.h
# Opt level: O3

bool read_landmark_data(string *filename,
                       vector<LandmarkObs,_std::allocator<LandmarkObs>_> *observations)

{
  pointer *ppLVar1;
  iterator __position;
  char cVar2;
  long lVar3;
  istream *piVar4;
  uint uVar5;
  double local_y;
  double local_x;
  LandmarkObs meas;
  string line_obs;
  ifstream in_file_obs;
  istringstream iss_obs;
  undefined1 auStack_408 [4];
  uint local_404;
  double local_400;
  double local_3f8;
  LandmarkObs local_3f0;
  undefined1 *local_3d8;
  undefined8 local_3d0;
  undefined1 local_3c8 [16];
  long local_3b8 [4];
  uint auStack_398 [122];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  std::ifstream::ifstream(local_3b8,(filename->_M_dataplus)._M_p,_S_in);
  lVar3 = *(long *)(local_3b8[0] + -0x18);
  uVar5 = *(uint *)((long)auStack_398 + lVar3);
  if ((uVar5 & 5) == 0) {
    local_3d8 = local_3c8;
    local_3d0 = 0;
    local_3c8[0] = 0;
    local_404 = uVar5;
    while( true ) {
      cVar2 = std::ios::widen((char)auStack_408 + (char)lVar3 + 'P');
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_3b8,(string *)&local_3d8,cVar2);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_3d8,_S_in);
      std::istream::_M_extract<double>((double *)local_1b0);
      std::istream::_M_extract<double>((double *)local_1b0);
      local_3f0.x = local_3f8;
      local_3f0.y = local_400;
      __position._M_current =
           (observations->super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (observations->super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<LandmarkObs,std::allocator<LandmarkObs>>::_M_realloc_insert<LandmarkObs_const&>
                  ((vector<LandmarkObs,std::allocator<LandmarkObs>> *)observations,__position,
                   &local_3f0);
      }
      else {
        (__position._M_current)->y = local_400;
        (__position._M_current)->id = local_3f0.id;
        *(undefined4 *)&(__position._M_current)->field_0x4 = local_3f0._4_4_;
        (__position._M_current)->x = local_3f8;
        ppLVar1 = &(observations->super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppLVar1 = *ppLVar1 + 1;
      }
      std::__cxx11::istringstream::~istringstream(local_1b0);
      std::ios_base::~ios_base(local_138);
      lVar3 = *(long *)(local_3b8[0] + -0x18);
    }
    uVar5 = local_404;
    if (local_3d8 != local_3c8) {
      operator_delete(local_3d8);
      uVar5 = local_404;
    }
  }
  std::ifstream::~ifstream(local_3b8);
  return (uVar5 & 5) == 0;
}

Assistant:

inline bool read_landmark_data(const std::string& filename, std::vector<LandmarkObs>& observations) {

	// Get file of landmark measurements:
	std::ifstream in_file_obs(filename.c_str(),std::ifstream::in);
	// Return if we can't open the file.
	if (!in_file_obs) {
		return false;
	}

	// Declare single line of landmark measurement file:
	std::string line_obs;

	// Run over each single line:
	while(getline(in_file_obs, line_obs)){

		std::istringstream iss_obs(line_obs);

		// Declare position values:
		double local_x, local_y;

		//read data from line to values:
		iss_obs >> local_x;
		iss_obs >> local_y;

		// Declare single landmark measurement:
		LandmarkObs meas;

		// Set values
		meas.x = local_x;
		meas.y = local_y;

		// Add to list of control measurements:
		observations.push_back(meas);
	}
	return true;
}